

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O1

void __thiscall QTemporaryDirPrivate::create(QTemporaryDirPrivate *this,QString *templateName)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  int iVar3;
  int *piVar4;
  char cVar5;
  int iVar6;
  long in_FS_OFFSET;
  QFileSystemEntry fileSystemEntry;
  QString local_d8;
  NativePath local_c0;
  QTemporaryFileName local_a8;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QTemporaryFileName::QTemporaryFileName(&local_a8,templateName);
  iVar6 = 0x100;
  do {
    QTemporaryFileName::generateNext(&local_c0,&local_a8);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_4_ = 0xaaaaaaaa;
    local_78._36_4_ = 0xaaaaaaaa;
    local_78._40_4_ = 0xaaaaaaaa;
    local_78._44_4_ = 0xaaaaaaaa;
    local_78._16_4_ = 0xaaaaaaaa;
    local_78._20_4_ = 0xaaaaaaaa;
    local_78._24_4_ = 0xaaaaaaaa;
    local_78._28_4_ = 0xaaaaaaaa;
    local_78._0_4_ = 0xaaaaaaaa;
    local_78._4_4_ = 0xaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,&local_a8);
    iVar3 = QFileSystemEngine::mkdir((char *)local_78,0x7000);
    if ((char)iVar3 == '\0') {
      piVar4 = __errno_location();
      cVar5 = (*piVar4 != 0x11) * '\x02';
    }
    else {
      this->success = true;
      QFileSystemEntry::filePath(&local_d8,(QFileSystemEntry *)local_78);
      data = &((this->pathOrError).d.d)->super_QArrayData;
      pcVar1 = (this->pathOrError).d.ptr;
      (this->pathOrError).d.d = local_d8.d.d;
      (this->pathOrError).d.ptr = local_d8.d.ptr;
      qVar2 = (this->pathOrError).d.size;
      (this->pathOrError).d.size = local_d8.d.size;
      local_d8.d.d = (Data *)data;
      local_d8.d.ptr = pcVar1;
      local_d8.d.size = qVar2;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      cVar5 = '\x01';
    }
    piVar4 = (int *)CONCAT44(local_78._28_4_,local_78._24_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._28_4_,local_78._24_4_),1,0x10);
      }
    }
    piVar4 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
      }
    }
    if (cVar5 != '\0') goto LAB_0025a158;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  cVar5 = '\x02';
LAB_0025a158:
  if (cVar5 == '\x02') {
    qt_error_string((QString *)local_78,-1);
    create();
  }
  if (&(local_a8.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.path.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTemporaryDirPrivate::create(const QString &templateName)
{
    QTemporaryFileName tfn(templateName);
    constexpr auto perms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    for (int i = 0; i < 256; ++i) {
        tfn.generateNext();
        QFileSystemEntry fileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
        if (QFileSystemEngine::mkdir(fileSystemEntry, perms)) {
            success = true;
            pathOrError = fileSystemEntry.filePath();
            return;
        }
#  ifdef Q_OS_WIN
        const int exists = ERROR_ALREADY_EXISTS;
        int code = GetLastError();
#  else
        const int exists = EEXIST;
        int code = errno;
#  endif
        if (code != exists)
            break;
    }
    pathOrError = qt_error_string();
    success = false;
}